

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::invalidateBackingStore_resizeHelper
          (QWidgetPrivate *this,QPoint *oldPos,QSize *oldSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  QPoint QVar3;
  int iVar6;
  int iVar7;
  QWidget *this_00;
  QWidgetPrivate *this_01;
  QWExtra *pQVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  QRect QVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  char cVar18;
  QWidgetRepaintManager *parent;
  int iVar19;
  int iVar20;
  QRect *pQVar21;
  QRect *this_02;
  long in_FS_OFFSET;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  QRegion parentExpose;
  QRegion dirty;
  QRegion staticChildren;
  undefined1 local_88 [8];
  QRect local_80;
  QRect local_70;
  undefined1 local_60 [16];
  undefined8 local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar22 = this_00->data->widget_attributes;
  iVar20 = (this->data).crect.x1.m_i;
  if (((this->data).crect.x2.m_i - iVar20) + 1 < (oldSize->wd).m_i) {
    iVar19 = (this->data).crect.y1.m_i;
    bVar9 = true;
  }
  else {
    iVar19 = (this->data).crect.y1.m_i;
    bVar9 = ((this->data).crect.y2.m_i - iVar19) + 1 < (oldSize->ht).m_i;
  }
  pQVar21 = &(this->data).crect;
  iVar6 = (oldPos->xp).m_i;
  iVar7 = (oldPos->yp).m_i;
  bVar10 = iVar19 != iVar7;
  bVar11 = iVar20 != iVar6;
  bVar14 = (bool)(bVar9 | (bVar10 || bVar11));
  local_48 = QWidget::rect(this_00);
  uVar12 = (oldSize->wd).m_i;
  uVar13 = (oldSize->ht).m_i;
  local_60._8_4_ = 0;
  local_60._12_4_ = 0;
  local_50 = CONCAT44(uVar13 - 1,uVar12 - 1);
  if (((uVar22 & 0x20) == 0) || (this->graphicsEffect != (QGraphicsEffect *)0x0)) {
    local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)local_60);
    if ((!bVar10 && !bVar11) &&
       (parent = maybeRepaintManager(this), parent != (QWidgetRepaintManager *)0x0)) {
      QWidgetRepaintManager::staticContents
                ((QWidgetRepaintManager *)&local_70,(QWidget *)parent,(QRect *)this_00);
      uVar16 = local_60._0_8_;
      QVar15 = local_70;
      local_60._0_4_ = local_70.x1.m_i;
      local_60._4_4_ = local_70.y1.m_i;
      uVar17 = local_60._0_8_;
      local_70._8_8_ = QVar15._8_8_;
      local_60._0_4_ = (undefined4)uVar16;
      local_60._4_4_ = SUB84(uVar16,4);
      local_70.x1.m_i = local_60._0_4_;
      local_70.y1.m_i = local_60._4_4_;
      local_60._0_8_ = uVar17;
      QRegion::~QRegion((QRegion *)&local_70);
    }
    cVar18 = QRegion::isEmpty();
    if (cVar18 == '\0') {
      local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)&local_70,&local_48,Rectangle);
      QRegion::operator-=((QRegion *)&local_70,(QRegion *)local_60);
      invalidateBackingStore<QRegion>(this,(QRegion *)&local_70);
      QRegion::~QRegion((QRegion *)&local_70);
    }
    else {
      invalidateBackingStore<QRect>(this,&local_48);
    }
    if (bVar14) {
      if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
        pQVar8 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                 _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if ((pQVar8 == (QWExtra *)0x0) || ((pQVar8->field_0x7c & 0x80) == 0)) {
          if (cVar18 != '\0') goto LAB_0030fa0f;
          local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QVar3 = *oldPos;
          local_70.y2.m_i = (*oldSize).ht.m_i + QVar3.yp.m_i.m_i + -1;
          local_70.x2.m_i = (*oldSize).wd.m_i + QVar3.xp.m_i.m_i + -1;
          local_70.x1.m_i = QVar3.xp.m_i;
          local_70.y1.m_i = QVar3.yp.m_i;
          QRegion::QRegion((QRegion *)&local_80,&local_70,Rectangle);
          QRegion::QRegion((QRegion *)&local_70,pQVar21,Rectangle);
          QRegion::operator-=((QRegion *)&local_80,(QRegion *)&local_70);
          QRegion::~QRegion((QRegion *)&local_70);
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
                     (QRegion *)&local_80);
        }
        else {
          local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::translated((QRegion *)&local_80,(QPoint *)&pQVar8->mask);
          QVar3 = *oldPos;
          local_70.y2.m_i = (*oldSize).ht.m_i + QVar3.yp.m_i.m_i + -1;
          local_70.x2.m_i = (*oldSize).wd.m_i + QVar3.xp.m_i.m_i + -1;
          local_70.x1.m_i = QVar3.xp.m_i;
          local_70.y1.m_i = QVar3.yp.m_i;
          QRegion::operator&=((QRegion *)&local_80,&local_70);
          if (cVar18 == '\0') {
            QRegion::QRegion((QRegion *)&local_70,pQVar21,Rectangle);
            QRegion::operator-=((QRegion *)&local_80,(QRegion *)&local_70);
            QRegion::~QRegion((QRegion *)&local_70);
          }
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
                     (QRegion *)&local_80);
        }
        QRegion::~QRegion((QRegion *)&local_80);
      }
      else {
LAB_0030fa0f:
        this_01 = *(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8);
        local_80._0_8_ = *oldPos;
        local_80.x2.m_i = (*oldSize).wd.m_i + local_80.x1.m_i + -1;
        local_80.y2.m_i = (*oldSize).ht.m_i + local_80.y1.m_i + -1;
        local_70 = effectiveRectFor(this,&local_80);
        invalidateBackingStore<QRect>(this_01,&local_70);
      }
    }
    pQVar21 = (QRect *)local_60;
  }
  else {
    if (bVar10 || bVar11) {
      iVar20 = iVar20 - iVar6;
      iVar19 = iVar19 - iVar7;
      if (!bVar9) {
        local_70._0_8_ = *oldPos;
        local_70.x2.m_i = (uVar12 - 1) + local_70.x1.m_i;
        local_70.y2.m_i = (uVar13 - 1) + local_70.y1.m_i;
        moveRect(this,&local_70,iVar20,iVar19);
        goto LAB_0030fab2;
      }
      uVar1 = (this->data).crect.x2;
      uVar4 = (this->data).crect.y2;
      uVar2 = (this->data).crect.x1;
      uVar5 = (this->data).crect.y1;
      uVar22 = (uVar1 - uVar2) + 1;
      uVar23 = (uVar4 - uVar5) + 1;
      uVar24 = -(uint)((int)uVar12 < (int)uVar22);
      uVar25 = -(uint)((int)uVar13 < (int)uVar23);
      QVar3 = *oldPos;
      local_70.y2.m_i = QVar3.yp.m_i.m_i + -1 + (~uVar25 & uVar23 | uVar13 & uVar25);
      local_70.x2.m_i = QVar3.xp.m_i.m_i + -1 + (~uVar24 & uVar22 | uVar12 & uVar24);
      local_70.x1.m_i = QVar3.xp.m_i;
      local_70.y1.m_i = QVar3.yp.m_i;
      moveRect(this,&local_70,iVar20,iVar19);
LAB_0030fa6e:
      cVar18 = QRect::contains((QRect *)(local_60 + 8),SUB81(&local_48,0));
      if (cVar18 == '\0') goto LAB_0030fab2;
    }
    else {
      if (bVar9) goto LAB_0030fa6e;
LAB_0030fab2:
      local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)&local_70,&local_48,Rectangle);
      QRegion::QRegion((QRegion *)&local_80,(QRect *)(local_60 + 8),Rectangle);
      QRegion::operator-=((QRegion *)&local_70,(QRegion *)&local_80);
      QRegion::~QRegion((QRegion *)&local_80);
      invalidateBackingStore<QRegion>(this,(QRegion *)&local_70);
      QRegion::~QRegion((QRegion *)&local_70);
      if (!bVar14) goto LAB_0030fdb0;
    }
    QVar3 = *oldPos;
    local_70.y2.m_i = (*oldSize).ht.m_i + QVar3.yp.m_i.m_i + -1;
    local_70.x2.m_i = (*oldSize).wd.m_i + QVar3.xp.m_i.m_i + -1;
    local_70.x1.m_i = QVar3.xp.m_i;
    local_70.y1.m_i = QVar3.yp.m_i;
    pQVar8 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar8 == (QWExtra *)0x0) || ((pQVar8->field_0x7c & 0x80) == 0)) {
      local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)&local_80,&local_70,Rectangle);
      this_02 = (QRect *)local_60;
      QRegion::QRegion((QRegion *)this_02,pQVar21,Rectangle);
      QRegion::operator-=((QRegion *)&local_80,(QRegion *)this_02);
    }
    else {
      local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)&local_80,&local_70,Rectangle);
      QRegion::translated((QRegion *)local_60,
                          (QPoint *)
                          &((this->extra)._M_t.
                            super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                            super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask);
      QRegion::operator&=((QRegion *)&local_80,(QRegion *)local_60);
      QRegion::~QRegion((QRegion *)local_60);
      this_02 = (QRect *)local_88;
      QRegion::translated((QRegion *)this_02,
                          (QPoint *)
                          &((this->extra)._M_t.
                            super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                            super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask);
      QRegion::operator&((QRegion *)local_60,this_02);
      QRegion::operator-=((QRegion *)&local_80,(QRegion *)local_60);
      QRegion::~QRegion((QRegion *)local_60);
    }
    pQVar21 = &local_80;
    QRegion::~QRegion((QRegion *)this_02);
    invalidateBackingStore<QRegion>
              (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
               (QRegion *)pQVar21);
  }
  QRegion::~QRegion((QRegion *)pQVar21);
LAB_0030fdb0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore_resizeHelper(const QPoint &oldPos, const QSize &oldSize)
{
    Q_Q(QWidget);
    Q_ASSERT(!q->isWindow());
    Q_ASSERT(q->parentWidget());

    const bool staticContents = q->testAttribute(Qt::WA_StaticContents);
    const bool sizeDecreased = (data.crect.width() < oldSize.width())
                               || (data.crect.height() < oldSize.height());

    const QPoint offset(data.crect.x() - oldPos.x(), data.crect.y() - oldPos.y());
    const bool parentAreaExposed = !offset.isNull() || sizeDecreased;
    const QRect newWidgetRect(q->rect());
    const QRect oldWidgetRect(0, 0, oldSize.width(), oldSize.height());

    if (!staticContents || graphicsEffect) {
        QRegion staticChildren;
        QWidgetRepaintManager *bs = nullptr;
        if (offset.isNull() && (bs = maybeRepaintManager()))
            staticChildren = bs->staticContents(q, oldWidgetRect);
        const bool hasStaticChildren = !staticChildren.isEmpty();

        if (hasStaticChildren) {
            QRegion dirty(newWidgetRect);
            dirty -= staticChildren;
            invalidateBackingStore(dirty);
        } else {
            // Entire widget needs repaint.
            invalidateBackingStore(newWidgetRect);
        }

        if (!parentAreaExposed)
            return;

        // Invalidate newly exposed area of the parent.
        if (!graphicsEffect && extra && extra->hasMask) {
            QRegion parentExpose(extra->mask.translated(oldPos));
            parentExpose &= QRect(oldPos, oldSize);
            if (hasStaticChildren)
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
            q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
        } else {
            if (hasStaticChildren && !graphicsEffect) {
                QRegion parentExpose(QRect(oldPos, oldSize));
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
                q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
            } else {
                q->parentWidget()->d_func()->invalidateBackingStore(effectiveRectFor(QRect(oldPos, oldSize)));
            }
        }
        return;
    }

    // Move static content to its new position.
    if (!offset.isNull()) {
        if (sizeDecreased) {
            const QSize minSize(qMin(oldSize.width(), data.crect.width()),
                                qMin(oldSize.height(), data.crect.height()));
            moveRect(QRect(oldPos, minSize), offset.x(), offset.y());
        } else {
            moveRect(QRect(oldPos, oldSize), offset.x(), offset.y());
        }
    }

    // Invalidate newly visible area of the widget.
    if (!sizeDecreased || !oldWidgetRect.contains(newWidgetRect)) {
        QRegion newVisible(newWidgetRect);
        newVisible -= oldWidgetRect;
        invalidateBackingStore(newVisible);
    }

    if (!parentAreaExposed)
        return;

    // Invalidate newly exposed area of the parent.
    const QRect oldRect(oldPos, oldSize);
    if (extra && extra->hasMask) {
        QRegion parentExpose(oldRect);
        parentExpose &= extra->mask.translated(oldPos);
        parentExpose -= (extra->mask.translated(data.crect.topLeft()) & data.crect);
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    } else {
        QRegion parentExpose(oldRect);
        parentExpose -= data.crect;
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    }
}